

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::protos::gen::ObservableEvents::~ObservableEvents(ObservableEvents *this)

{
  ObservableEvents *this_local;
  
  ~ObservableEvents(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

ObservableEvents::~ObservableEvents() = default;